

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

FrameOpResult __thiscall
QRhiGles2::beginOffscreenFrame(QRhiGles2 *this,QRhiCommandBuffer **cb,BeginFrameFlags param_2)

{
  QGles2CommandBuffer *this_00;
  GLuint GVar1;
  Command *__src;
  undefined1 auVar2 [16];
  bool bVar3;
  FrameOpResult FVar4;
  Command *__dest;
  int iVar5;
  ulong uVar6;
  
  bVar3 = ensureContext(this,(QSurface *)0x0);
  if (bVar3) {
    (this->ofr).active = true;
    executeDeferredReleases(this);
    this_00 = &(this->ofr).cbWrapper;
    (this->ofr).cbWrapper.recordingPass = NoPass;
    (this->ofr).cbWrapper.passNeedsResourceTracking = true;
    (this->ofr).cbWrapper.currentTarget = (QRhiRenderTarget *)0x0;
    QGles2CommandBuffer::resetCommands(this_00);
    (this->ofr).cbWrapper.currentPipelineGeneration = 0;
    (this->ofr).cbWrapper.currentGraphicsPipeline = (QRhiGraphicsPipeline *)0x0;
    (this->ofr).cbWrapper.currentComputePipeline = (QRhiComputePipeline *)0x0;
    (this->ofr).cbWrapper.currentGraphicsSrb = (QRhiShaderResourceBindings *)0x0;
    (this->ofr).cbWrapper.currentComputeSrb = (QRhiShaderResourceBindings *)0x0;
    *(undefined8 *)((long)&(this->ofr).cbWrapper.currentComputeSrb + 5) = 0;
    QHash<QRhiResource_*,_std::pair<int,_bool>_>::clear
              (&(this->ofr).cbWrapper.computePassState.writtenResources);
    memset((this->ofr).cbWrapper.textureUnitState,0,0x100);
    if (((((this->rhiFlags).super_QFlagsStorageHelper<QRhi::Flag,_4>.super_QFlagsStorage<QRhi::Flag>
           .i & 8) != 0) && (((this->caps).field_0x3c & 0x40) != 0)) &&
       ((this->ofr).tsQueries[0] == 0)) {
      (*(this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions[7])
                (2,(this->ofr).tsQueries);
    }
    GVar1 = (this->ofr).tsQueries[0];
    iVar5 = (this->ofr).cbWrapper.commands.p;
    if (iVar5 == (this->ofr).cbWrapper.commands.a) {
      uVar6 = (long)iVar5 + 0x400;
      (this->ofr).cbWrapper.commands.a = (int)uVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x68),8) == 0) {
        uVar6 = SUB168(auVar2 * ZEXT816(0x68),0);
      }
      __dest = (Command *)operator_new__(uVar6);
      __src = (this->ofr).cbWrapper.commands.v;
      if (__src != (Command *)0x0) {
        memcpy(__dest,__src,(long)iVar5 * 0x68);
        operator_delete__(__src);
        iVar5 = (this->ofr).cbWrapper.commands.p;
      }
      (this->ofr).cbWrapper.commands.v = __dest;
    }
    else {
      __dest = (this->ofr).cbWrapper.commands.v;
    }
    (this->ofr).cbWrapper.commands.p = iVar5 + 1;
    __dest[iVar5].cmd = BeginFrame;
    __dest[iVar5].args.beginFrame.timestampQuery = GVar1;
    *cb = &this_00->super_QRhiCommandBuffer;
    FVar4 = FrameOpSuccess;
  }
  else {
    FVar4 = (uint)this->contextLost * 2 + FrameOpError;
  }
  return FVar4;
}

Assistant:

QRhi::FrameOpResult QRhiGles2::beginOffscreenFrame(QRhiCommandBuffer **cb, QRhi::BeginFrameFlags)
{
    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    ofr.active = true;

    executeDeferredReleases();
    ofr.cbWrapper.resetState();

    if (rhiFlags.testFlag(QRhi::EnableTimestamps) && caps.timestamps) {
        if (!ofr.tsQueries[0])
            f->glGenQueries(2, ofr.tsQueries);
    }

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::BeginFrame, ofr.tsQueries[0]);
    *cb = &ofr.cbWrapper;

    return QRhi::FrameOpSuccess;
}